

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>::
     Operation<int,long,duckdb::ArgMinMaxState<int,long>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,false>>
               (ArgMinMaxState<int,_long> *state,int *x,long *y,AggregateBinaryInput *binary)

{
  bool bVar1;
  ArgMinMaxState<int,_long> *in_RCX;
  TemplatedValidityMask<unsigned_long> *in_RDX;
  long *in_RSI;
  byte *in_RDI;
  AggregateBinaryInput *in_stack_ffffffffffffffc8;
  byte *pbVar2;
  idx_t in_stack_ffffffffffffffd0;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffd8;
  
  if ((*in_RDI & 1) == 0) {
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    if (bVar1) {
      pbVar2 = in_RDI;
      TemplatedValidityMask<unsigned_long>::RowIsValid(in_RDX,(idx_t)in_RSI);
      Assign<int,long,duckdb::ArgMinMaxState<int,long>>
                (in_RCX,(int *)in_RDX,in_RSI,SUB81((ulong)pbVar2 >> 0x38,0));
      *in_RDI = 1;
    }
  }
  else {
    Execute<int,long,duckdb::ArgMinMaxState<int,long>>
              (in_RCX,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}